

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O1

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObjectManager::LocateObject
          (CSharedMemoryObjectManager *this,CPalThread *pthr,CPalString *psObjectToLocate,
          CAllowedObjectTypes *paot,IPalObject **ppobj)

{
  CPalString *pCVar1;
  int iVar2;
  PAL_ERROR PVar3;
  size_t sVar4;
  CSharedMemoryObject *pCVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SHMPTR shmptr;
  SHMObjData *psmod;
  char16_t *string1;
  CSharedMemoryObject *pCVar7;
  undefined8 uVar8;
  CPalThread *pthr_00;
  PLIST_ENTRY ple;
  bool bVar9;
  undefined1 auStack_80 [8];
  CObjectAttributes oa;
  CSharedMemoryObject *local_58;
  CSharedMemoryObject *pshmobj;
  IPalObject **local_48;
  CPalThread *local_40;
  CPalString *local_38;
  undefined8 *puVar6;
  
  pshmobj = (CSharedMemoryObject *)paot;
  local_38 = psObjectToLocate;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","LocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x202);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (local_38 == (CPalString *)0x0) {
    fprintf(_stderr,"] %s %s:%d","LocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x203);
    fprintf(_stderr,"Expression: NULL != psObjectToLocate\n");
  }
  if (local_38->m_pwsz == (WCHAR *)0x0) {
    fprintf(_stderr,"] %s %s:%d","LocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x204);
    fprintf(_stderr,"Expression: NULL != psObjectToLocate->GetString()\n");
  }
  pCVar1 = local_38;
  sVar4 = PAL_wcslen(local_38->m_pwsz);
  if (sVar4 != pCVar1->m_dwStringLength) {
    fprintf(_stderr,"] %s %s:%d","LocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x205);
    fprintf(_stderr,
            "Expression: PAL_wcslen(psObjectToLocate->GetString()) == psObjectToLocate->GetStringLength()\n"
           );
  }
  if (ppobj == (IPalObject **)0x0) {
    fprintf(_stderr,"] %s %s:%d","LocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x206);
    fprintf(_stderr,"Expression: NULL != ppobj\n");
  }
  local_48 = ppobj;
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_00135c5e;
  oa.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)&this->m_csListLock;
  local_40 = pthr;
  InternalEnterCriticalSection(pthr,(PCRITICAL_SECTION)oa.pSecurityAttributes);
  pCVar7 = (CSharedMemoryObject *)0x0;
  ple = &this->m_leNamedObjects;
  do {
    ple = ple->Flink;
    if (ple == &this->m_leNamedObjects) break;
    pCVar5 = CSharedMemoryObject::GetObjectFromListLink(ple);
    iVar2 = (*(pCVar5->super_CPalObjectBase).super_IPalObject._vptr_IPalObject[1])(pCVar5);
    puVar6 = (undefined8 *)CONCAT44(extraout_var,iVar2);
    if (puVar6 == (undefined8 *)0x0) {
      fprintf(_stderr,"] %s %s:%d","LocateObject",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
              ,0x223);
      fprintf(_stderr,"Expression: NULL != poa\n");
    }
    bVar9 = true;
    if (*(DWORD *)(puVar6 + 1) == local_38->m_dwStringLength) {
      iVar2 = PAL_wcscmp((char16_t *)*puVar6,local_38->m_pwsz);
      bVar9 = iVar2 != 0;
      if (!bVar9) {
        pCVar7 = pCVar5;
      }
    }
  } while (bVar9);
  if (pCVar7 == (CSharedMemoryObject *)0x0) {
    SHMLock();
    shmptr = SHMGetInfo(SIID_NAMED_OBJECTS);
    if (shmptr == 0) {
      shmptr = 0;
      psmod = (SHMObjData *)0x0;
      string1 = (char16_t *)0x0;
      pthr_00 = local_40;
    }
    else {
      string1 = (char16_t *)0x0;
      do {
        psmod = (SHMObjData *)SHMPtrToPtr(shmptr);
        if (psmod == (SHMObjData *)0x0) {
          local_38 = (CPalString *)0x16fe67;
          uVar8 = 0x279;
          psmod = (SHMObjData *)0x0;
LAB_00135afc:
          pthr_00 = local_40;
          shmptr = 0;
          fprintf(_stderr,"] %s %s:%d","LocateObject",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
                  ,uVar8);
          fprintf(_stderr,(char *)local_38);
          goto LAB_00135b39;
        }
        if (psmod->dwNameLength == local_38->m_dwStringLength) {
          string1 = (char16_t *)SHMPtrToPtr(psmod->shmObjName);
          if (string1 == (char16_t *)0x0) {
            uVar8 = 0x270;
            local_38 = (CPalString *)0x16fe46;
            string1 = (char16_t *)0x0;
            goto LAB_00135afc;
          }
          iVar2 = PAL_wcscmp(string1,local_38->m_pwsz);
          pthr_00 = local_40;
          if (iVar2 == 0) goto LAB_00135b39;
        }
        shmptr = psmod->shmNextObj;
      } while (shmptr != 0);
      shmptr = 0;
      pthr_00 = local_40;
    }
LAB_00135b39:
    if (shmptr == 0) {
      PVar3 = 0x7b;
    }
    else {
      local_58 = (CSharedMemoryObject *)0x0;
      auStack_80 = (undefined1  [8])0x0;
      oa.sObjectName.m_pwsz = (WCHAR *)0x0;
      oa.sObjectName.m_dwStringLength = 0;
      oa.sObjectName.m_dwMaxLength = 0;
      if (string1 != (char16_t *)0x0) {
        sVar4 = PAL_wcslen(string1);
        oa.sObjectName.m_pwsz = (WCHAR *)CONCAT44((int)sVar4 + 1,(int)sVar4);
        auStack_80 = (undefined1  [8])string1;
      }
      bVar9 = CAllowedObjectTypes::IsTypeAllowed((CAllowedObjectTypes *)pshmobj,psmod->eTypeId);
      if (bVar9) {
        if (CObjectType::s_rgotIdMapping[psmod->eTypeId] == (CObjectType *)0x0) {
          PVar3 = 0;
          fprintf(_stderr,"] %s %s:%d","LocateObject",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
                  ,0x295);
          fprintf(_stderr,"Invalid object type ID in shared memory info\n");
        }
        else {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_00135c5e;
          PVar3 = ImportSharedObjectIntoProcess
                            (this,pthr_00,CObjectType::s_rgotIdMapping[psmod->eTypeId],
                             (CObjectAttributes *)auStack_80,shmptr,psmod,true,&local_58);
          if (PVar3 != 0) goto LAB_00135be1;
          *local_48 = (IPalObject *)local_58;
        }
      }
      else {
        PVar3 = 6;
LAB_00135be1:
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_00135c5e;
      }
    }
    SHMRelease();
  }
  else {
    iVar2 = (**(pCVar7->super_CPalObjectBase).super_IPalObject._vptr_IPalObject)(pCVar7);
    bVar9 = CAllowedObjectTypes::IsTypeAllowed
                      ((CAllowedObjectTypes *)pshmobj,
                       *(PalObjectTypeId *)CONCAT44(extraout_var_00,iVar2));
    pthr_00 = local_40;
    if (bVar9) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00135c5e;
      (*(pCVar7->super_CPalObjectBase).super_IPalObject._vptr_IPalObject[7])(pCVar7);
      *local_48 = (IPalObject *)pCVar7;
      PVar3 = 0;
    }
    else {
      PVar3 = 6;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00135c5e;
    }
  }
  InternalLeaveCriticalSection(pthr_00,(PCRITICAL_SECTION)oa.pSecurityAttributes);
  if (PAL_InitializeChakraCoreCalled != false) {
    return PVar3;
  }
LAB_00135c5e:
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObjectManager::LocateObject(
    CPalThread *pthr,
    CPalString *psObjectToLocate,
    CAllowedObjectTypes *paot,
    IPalObject **ppobj               // OUT
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjExisting = NULL;
    SHMPTR shmSharedObjectData = SHMNULL;
    SHMPTR shmObjectListEntry = SHMNULL;
    SHMObjData *psmod = NULL;
    LPWSTR pwsz = NULL;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != psObjectToLocate);
    _ASSERTE(NULL != psObjectToLocate->GetString());
    _ASSERTE(PAL_wcslen(psObjectToLocate->GetString()) == psObjectToLocate->GetStringLength());
    _ASSERTE(NULL != ppobj);

    ENTRY("CSharedMemoryObjectManager::LocateObject "
        "(this=%p, pthr=%p, psObjectToLocate=%p, paot=%p, "
        "ppobj=%p)\n",
        this,
        pthr,
        psObjectToLocate,
        paot,
        ppobj
        );

    TRACE("Searching for object name %S\n", psObjectToLocate->GetString());

    InternalEnterCriticalSection(pthr, &m_csListLock);

    //
    // Search the local named object list for this object
    //

    for (PLIST_ENTRY ple = m_leNamedObjects.Flink;
         ple != &m_leNamedObjects;
         ple = ple->Flink)
    {
        CObjectAttributes *poa;
        CSharedMemoryObject *pshmobj =
            CSharedMemoryObject::GetObjectFromListLink(ple);

        poa = pshmobj->GetObjectAttributes();
        _ASSERTE(NULL != poa);

        if (poa->sObjectName.GetStringLength() != psObjectToLocate->GetStringLength())
        {
            continue;
        }

        if (0 != PAL_wcscmp(poa->sObjectName.GetString(), psObjectToLocate->GetString()))
        {
            continue;
        }

        //
        // This object has the name we're looking for
        //

        pobjExisting = static_cast<IPalObject*>(pshmobj);
        break;        
    } 

    if (NULL != pobjExisting)
    {
        //
        //  Validate the located object's type
        //

        if (paot->IsTypeAllowed(
                pobjExisting->GetObjectType()->GetId()
                ))
        {
            TRACE("Local object exists with compatible type\n");
            
            //
            // Add a reference to the found object
            //

            pobjExisting->AddReference();
            *ppobj = pobjExisting;
        }
        else
        {
            TRACE("Local object exists w/ incompatible type\n");            
            palError = ERROR_INVALID_HANDLE;
        }
        
        goto LocateObjectExit;
    }

    //
    // Search the shared memory named object list for a matching object
    //
    
    SHMLock();
    
    shmObjectListEntry = SHMGetInfo(SIID_NAMED_OBJECTS);
    while (SHMNULL != shmObjectListEntry)
    {
        psmod = SHMPTR_TO_TYPED_PTR(SHMObjData, shmObjectListEntry);
        if (NULL != psmod)
        {
            if (psmod->dwNameLength == psObjectToLocate->GetStringLength())
            {
                pwsz = SHMPTR_TO_TYPED_PTR(WCHAR, psmod->shmObjName);
                if (NULL != pwsz)
                {
                    if (0 == PAL_wcscmp(pwsz, psObjectToLocate->GetString()))
                    {
                        //
                        // This is the object we were looking for.
                        //

                        shmSharedObjectData = shmObjectListEntry;
                        break;
                    }
                }
                else
                {
                    ASSERT("Unable to map psmod->shmObjName\n");
                    break;
                }                
            }

            shmObjectListEntry = psmod->shmNextObj;
        }
        else
        {
            ASSERT("Unable to map shmObjectListEntry\n");
            break;
        }
    }

    if (SHMNULL != shmSharedObjectData)
    {
        CSharedMemoryObject *pshmobj = NULL;
        CObjectAttributes oa(pwsz, NULL);

        //
        // Check if the type is allowed
        //

        if (!paot->IsTypeAllowed(psmod->eTypeId))
        {
            TRACE("Remote object exists w/ incompatible type\n");
            palError = ERROR_INVALID_HANDLE;
            goto LocateObjectExitSHMRelease;
        }
        
        //
        // Get the local instance of the CObjectType
        //
        
        CObjectType *pot = CObjectType::GetObjectTypeById(psmod->eTypeId);
        if (NULL == pot)
        {
            ASSERT("Invalid object type ID in shared memory info\n");
            goto LocateObjectExitSHMRelease;
        }

        TRACE("Remote object exists compatible type -- importing\n");
        
        //
        // Create the local state for the shared object
        //

        palError = ImportSharedObjectIntoProcess(
            pthr,
            pot,
            &oa,
            shmSharedObjectData,
            psmod,
            TRUE,
            &pshmobj
            );

        if (NO_ERROR == palError)
        {   
            *ppobj = static_cast<IPalObject*>(pshmobj);
        }
        else
        {
            ERROR("Failure initializing object from shared data\n");
            goto LocateObjectExitSHMRelease;
        }
        
    }
    else
    {
        //
        // The object was not found
        //

        palError = ERROR_INVALID_NAME;
    }

LocateObjectExitSHMRelease:

    SHMRelease();

LocateObjectExit:

    InternalLeaveCriticalSection(pthr, &m_csListLock);

    LOGEXIT("CSharedMemoryObjectManager::LocateObject returns %d\n", palError);

    return palError;
}